

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_>::size
          (Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  Delimited<kj::ArrayPtr<int>_> *e;
  Delimited<kj::ArrayPtr<int>_> *this_00;
  long lVar6;
  
  ensureStringifiedInitialized(this);
  sVar2 = (this->stringified).size_;
  if (sVar2 == 0) {
    sVar2 = 0;
  }
  else {
    this_00 = (this->stringified).ptr;
    lVar5 = sVar2 * 0x38;
    sVar2 = 0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      if (bVar3) {
        bVar4 = false;
      }
      lVar6 = 0;
      if (!bVar3) {
        lVar6 = (this->delimiter).content.size_ - 1;
      }
      sVar1 = Delimited<kj::ArrayPtr<int>_>::size(this_00);
      sVar2 = sVar1 + sVar2 + lVar6;
      this_00 = this_00 + 1;
      lVar5 = lVar5 + -0x38;
      bVar3 = bVar4;
    } while (lVar5 != 0);
  }
  return sVar2;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }